

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.h
# Opt level: O3

UBool __thiscall
icu_63::LocaleCacheKey<icu_63::CollationCacheEntry>::operator==
          (LocaleCacheKey<icu_63::CollationCacheEntry> *this,CacheKeyBase *other)

{
  UBool UVar1;
  
  if (this == (LocaleCacheKey<icu_63::CollationCacheEntry> *)other) {
    UVar1 = '\x01';
  }
  else {
    UVar1 = CacheKey<icu_63::CollationCacheEntry>::operator==
                      (&this->super_CacheKey<icu_63::CollationCacheEntry>,other);
    if (UVar1 != '\0') {
      UVar1 = Locale::operator==(&this->fLoc,(Locale *)(other + 1));
      return UVar1;
    }
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

virtual UBool operator == (const CacheKeyBase &other) const {
       // reflexive
       if (this == &other) {
           return TRUE;
       }
       if (!CacheKey<T>::operator == (other)) {
           return FALSE;
       }
       // We know this and other are of same class because operator== on
       // CacheKey returned true.
       const LocaleCacheKey<T> *fOther =
               static_cast<const LocaleCacheKey<T> *>(&other);
       return fLoc == fOther->fLoc;
   }